

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_get_set_Test::ObjectTest_basic_get_set_Test(ObjectTest_basic_get_set_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a1790;
  return;
}

Assistant:

TEST(ObjectTest, basic_get_set) {
	object obj;

	EXPECT_TRUE(obj.get<std::set<bool>>().empty());
	EXPECT_TRUE(obj.get<std::set<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::set<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::set<short>>().empty());
	EXPECT_TRUE(obj.get<std::set<int>>().empty());
	EXPECT_TRUE(obj.get<std::set<long>>().empty());
	EXPECT_TRUE(obj.get<std::set<long long>>().empty());
	EXPECT_TRUE(obj.get<std::set<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::set<float>>().empty());
	EXPECT_TRUE(obj.get<std::set<double>>().empty());
	EXPECT_TRUE(obj.get<std::set<long double>>().empty());
	EXPECT_TRUE(obj.get<std::set<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::set<object>>().empty());
}